

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SWDAnalyzerResults::GetBubbleText
          (SWDAnalyzerResults *this,Frame *f,DisplayBase display_base,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Frame FVar3;
  SWDRegisters reg;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  ulong *puVar10;
  long *plVar11;
  _Alloc_hider _Var12;
  string data_str;
  string reg_value;
  string reg_name;
  string result;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  FVar3 = f[0x20];
  switch(FVar3) {
  case (Frame)0x2:
    int2str_sal_abi_cxx11_(&local_130,*(U64 *)(f + 0x10),Decimal,0x40);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x10e0d6);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0.field_2._8_8_ = plVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_b0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
    paVar1 = &local_150.field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_150.field_2._M_allocated_capacity = *puVar10;
      local_150.field_2._8_8_ = puVar7[3];
      local_150._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_150.field_2._M_allocated_capacity = *puVar10;
      local_150._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_150._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"rst","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"reset","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Line Reset","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    break;
  case (Frame)0x3:
    int2str_sal_abi_cxx11_(&local_150,(ulong)(*(uint *)(f + 0x10) >> 1 & 0xc),display_base,4);
    SWDRequestFrame::GetRegisterName_abi_cxx11_(&local_b0,(SWDRequestFrame *)f);
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Request ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_f0 = &local_e0;
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_e0 = *plVar11;
      lStack_d8 = plVar8[3];
    }
    else {
      local_e0 = *plVar11;
      local_f0 = (long *)*plVar8;
    }
    local_e8 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
    paVar1 = &local_110.field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
    paVar2 = &local_130.field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130.field_2._8_8_ = plVar8[3];
      local_130._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_130._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    int2str_sal_abi_cxx11_(&local_130,*(U64 *)(f + 0x18),display_base,8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"rq","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"req","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"request","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"request ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_f0 = &local_e0;
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_e0 = *plVar11;
      lStack_d8 = plVar8[3];
    }
    else {
      local_e0 = *plVar11;
      local_f0 = (long *)*plVar8;
    }
    local_e8 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130.field_2._8_8_ = plVar8[3];
      local_130._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_130._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Request ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_e0 = *plVar11;
      lStack_d8 = plVar8[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar11;
      local_f0 = (long *)*plVar8;
    }
    local_e8 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130.field_2._8_8_ = plVar8[3];
      local_130._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_130._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    _Var12._M_p = (pointer)local_90;
    if (local_90 != &local_80) {
LAB_00108340:
      operator_delete(_Var12._M_p);
    }
    goto LAB_00108345;
  case (Frame)0x4:
    paVar1 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Turnaround","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"T","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"trn","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"turn","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    break;
  case (Frame)0x5:
    lVar4 = *(long *)(f + 0x10);
    paVar1 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar1;
    if (lVar4 == 4) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ACK FAULT","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar1) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_150._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"FAULT","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
    }
    else if (lVar4 == 2) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ACK WAIT","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar1) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_150._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"WAIT","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
    }
    else if (lVar4 == 1) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ACK OK","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar1) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_150._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"OK","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"ACK <unknown> probably disconnected","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar1) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_150._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ACK <unknown>","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar1) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_150._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"disc","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_150);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ACK","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    break;
  case (Frame)0x6:
    int2str_sal_abi_cxx11_(&local_150,*(U64 *)(f + 0x10),display_base,0x20);
    reg = *(SWDRegisters *)(f + 0x18);
    GetRegisterName_abi_cxx11_(&local_b0,reg);
    GetRegisterValueDesc_abi_cxx11_(&local_130,reg,*(U32 *)(f + 0x10),display_base);
    if (local_130._M_string_length != 0) {
      std::operator+(&local_50,"WData ",&local_150);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_80._M_allocated_capacity = *psVar9;
        local_80._8_8_ = plVar8[3];
        local_90 = &local_80;
      }
      else {
        local_80._M_allocated_capacity = *psVar9;
        local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar8;
      }
      local_88 = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
      psVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_d0.field_2._M_allocated_capacity = *psVar9;
        local_d0.field_2._8_8_ = puVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar9;
        local_d0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_d0._M_string_length = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      plVar8 = puVar7 + 2;
      if ((long *)*puVar7 == plVar8) {
        local_e0 = *plVar8;
        lStack_d8 = puVar7[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar8;
        local_f0 = (long *)*puVar7;
      }
      local_e8 = puVar7[1];
      *puVar7 = plVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_130._M_dataplus._M_p);
      psVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_110.field_2._M_allocated_capacity = *psVar9;
        local_110.field_2._8_8_ = puVar7[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar9;
        local_110._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_110._M_string_length = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    std::operator+(&local_d0,"WData ",&local_150);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_e0 = *plVar8;
      lStack_d8 = puVar7[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar8;
      local_f0 = (long *)*puVar7;
    }
    local_e8 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0._M_dataplus._M_p);
    paVar1 = &local_110.field_2;
    psVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = puVar7[3];
      local_110._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_110._M_string_length = puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_110._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"WData","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    std::operator+(&local_110,"WData ",&local_150);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    _Var12._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) goto LAB_00108340;
LAB_00108345:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_00107fe8;
    goto LAB_00107fe3;
  case (Frame)0x7:
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Data parity","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
    paVar1 = &local_150.field_2;
    puVar10 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_150.field_2._M_allocated_capacity = *puVar10;
      local_150.field_2._8_8_ = plVar8[3];
      local_150._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_150.field_2._M_allocated_capacity = *puVar10;
      local_150._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_150._M_string_length = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pcVar5 = "BD1";
    if (*(long *)(f + 0x10) == 0) {
      pcVar5 = "BD0";
    }
    pcVar6 = "BD1";
    if (*(long *)(f + 0x10) == 0) {
      pcVar6 = "BD0";
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,pcVar5 + 2,pcVar6 + 3);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"prty","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Parity","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    goto LAB_001083d3;
  case (Frame)0x8:
    paVar1 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Trailing bits","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Trail","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_150);
    break;
  default:
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_allocated_capacity =
         local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (FVar3 == (Frame)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_150,0,(char *)0x0,0x10e1ab);
    }
    else if (FVar3 == (Frame)0x1) {
      int2str_sal_abi_cxx11_(&local_130,*(U64 *)(f + 0x18),Decimal,0x40);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x10e1a6)
      ;
      psVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0.field_2._8_8_ = puVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_b0._M_string_length = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_150,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_150);
LAB_001083d3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_00107fe8;
    goto LAB_00107fe3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
LAB_00107fe3:
    operator_delete(local_150._M_dataplus._M_p);
  }
LAB_00107fe8:
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void SWDAnalyzerResults::GetBubbleText( const Frame& f, DisplayBase display_base, std::vector<std::string>& results )
{
    results.clear();

    std::string result;

    if( f.mType == SWDFT_Request )
    {
        SWDRequestFrame& req( ( SWDRequestFrame& )f );

        std::string addr_str( int2str_sal( req.GetAddr(), display_base, 4 ) );
        std::string reg_name( req.GetRegisterName() );

        results.push_back( std::string( "Request " ) + ( req.IsAccessPort() ? " AccessPort" : " DebugPort" ) +
                           ( req.IsRead() ? " Read" : " Write" ) + " " + reg_name );

        results.push_back( int2str_sal( req.mData2, display_base ) );
        results.push_back( "rq" );
        results.push_back( "req" );
        results.push_back( "request" );
        results.push_back( std::string( "request " ) + ( req.IsAccessPort() ? "AP" : "DP" ) + ( req.IsRead() ? " R" : " W" ) + " " +
                           reg_name );

        results.push_back( std::string( "Request " ) + ( req.IsAccessPort() ? "AccessPort" : "DebugPort" ) +
                           ( req.IsRead() ? " Read" : " Write" ) + " " + reg_name );
    }
    else if( f.mType == SWDFT_LineReset )
    {
        results.push_back( "Line Reset " + int2str( f.mData1 ) + " bits" );
        results.push_back( "rst" );
        results.push_back( "reset" );
        results.push_back( "Line Reset" );
    }
    else if( f.mType == SWDFT_Turnaround )
    {
        results.push_back( "Turnaround" );
        results.push_back( "T" );
        results.push_back( "trn" );
        results.push_back( "turn" );
    }
    else if( f.mType == SWDFT_ACK )
    {
        if( f.mData1 == ACK_OK )
        {
            results.push_back( "ACK OK" );
            results.push_back( "OK" );
        }
        else if( f.mData1 == ACK_WAIT )
        {
            results.push_back( "ACK WAIT" );
            results.push_back( "WAIT" );
        }
        else if( f.mData1 == ACK_FAULT )
        {
            results.push_back( "ACK FAULT" );
            results.push_back( "FAULT" );
        }
        else
        {
            results.push_back( "ACK <unknown> probably disconnected" );
            results.push_back( "ACK <unknown>" );
            results.push_back( "disc" );
        }

        results.push_back( "ACK" );
    }
    else if( f.mType == SWDFT_WData )
    {
        std::string data_str( int2str_sal( f.mData1, display_base, 32 ) );
        SWDRegisters reg( SWDRegisters( f.mData2 ) );
        std::string reg_name( GetRegisterName( reg ) );
        std::string reg_value( GetRegisterValueDesc( reg, U32( f.mData1 ), display_base ) );

        if( !reg_value.empty() )
            results.push_back( "WData " + data_str + " reg " + reg_name + " bits " + reg_value );
        results.push_back( "WData " + data_str + " reg " + reg_name );
        results.push_back( "WData" );
        results.push_back( "WData " + data_str );
    }
    else if( f.mType == SWDFT_DataParity )
    {
        results.push_back( std::string( "Data parity" ) + ( f.mData2 ? "ok" : "NOT OK" ) );
        results.push_back( f.mData1 ? "1" : "0" );
        results.push_back( "prty" );
        results.push_back( "Parity" );
    }
    else if( f.mType == SWDFT_TrailingBits )
    {
        results.push_back( "Trailing bits" );
        results.push_back( "Trail" );
    }
    else
    {
        std::string msg;

        switch( f.mType )
        {
        case SWDFT_Bit:
            msg = "bit " + int2str( f.mData2 );
            break;
        case SWDFT_WData:
            msg = "data";
            break;
        case SWDFT_DataParity:
            msg = "dprty";
            break;
        case SWDFT_Error:
            msg = "err";
            break;
        case SWDFT_Request:
            msg = "request";
            break;
        }

        results.push_back( msg );
    }
}